

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_rev16(TCGContext_conflict1 *tcg_ctx,TCGv_i32 dest,TCGv_i32 var)

{
  TCGTemp *ts;
  TCGv_i32 pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *ts_00;
  uintptr_t o_2;
  
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  pTVar1 = tcg_const_i32_aarch64(tcg_ctx,0xff00ff);
  tcg_gen_shri_i32_aarch64(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),var,8);
  ts_00 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_and_i32,(TCGArg)ts,(TCGArg)ts,(TCGArg)ts_00);
  pTVar1 = var + (long)&tcg_ctx->pool_cur;
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_and_i32,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)ts_00);
  tcg_gen_shli_i32_aarch64(tcg_ctx,var,var,8);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_or_i32,(TCGArg)(dest + (long)tcg_ctx),(TCGArg)pTVar1,
                      (TCGArg)ts);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts_00);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_rev16(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 var)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 mask = tcg_const_i32(tcg_ctx, 0x00ff00ff);
    tcg_gen_shri_i32(tcg_ctx, tmp, var, 8);
    tcg_gen_and_i32(tcg_ctx, tmp, tmp, mask);
    tcg_gen_and_i32(tcg_ctx, var, var, mask);
    tcg_gen_shli_i32(tcg_ctx, var, var, 8);
    tcg_gen_or_i32(tcg_ctx, dest, var, tmp);
    tcg_temp_free_i32(tcg_ctx, mask);
    tcg_temp_free_i32(tcg_ctx, tmp);
}